

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void reloadTableSchema(Parse *pParse,Table *pTab,char *zName)

{
  uint uVar1;
  int iVar2;
  Vdbe *p;
  Trigger *pTVar3;
  char *pcVar4;
  Schema **ppSVar5;
  ulong uVar6;
  ulong uVar7;
  
  p = sqlite3GetVdbe(pParse);
  if (p != (Vdbe *)0x0) {
    if (pTab->pSchema == (Schema *)0x0) {
      uVar7 = 0xfff0bdc0;
    }
    else {
      uVar1 = pParse->db->nDb;
      if ((int)uVar1 < 1) {
        uVar7 = 0;
      }
      else {
        ppSVar5 = &pParse->db->aDb->pSchema;
        uVar7 = 0;
        do {
          if (*ppSVar5 == pTab->pSchema) goto LAB_001a0d36;
          uVar7 = uVar7 + 1;
          ppSVar5 = ppSVar5 + 4;
        } while (uVar1 != uVar7);
        uVar7 = (ulong)uVar1;
      }
    }
LAB_001a0d36:
    for (pTVar3 = sqlite3TriggerList(pParse,pTab); pTVar3 != (Trigger *)0x0; pTVar3 = pTVar3->pNext)
    {
      if (pTVar3->pSchema == (Schema *)0x0) {
        uVar6 = 0xfff0bdc0;
      }
      else {
        uVar1 = pParse->db->nDb;
        if ((int)uVar1 < 1) {
          uVar6 = 0;
        }
        else {
          ppSVar5 = &pParse->db->aDb->pSchema;
          uVar6 = 0;
          do {
            if (*ppSVar5 == pTVar3->pSchema) goto LAB_001a0d84;
            uVar6 = uVar6 + 1;
            ppSVar5 = ppSVar5 + 4;
          } while (uVar1 != uVar6);
          uVar6 = (ulong)uVar1;
        }
      }
LAB_001a0d84:
      pcVar4 = pTVar3->zName;
      iVar2 = sqlite3VdbeAddOp3(p,0x6e,(int)uVar6,0,0);
      sqlite3VdbeChangeP4(p,iVar2,pcVar4,0);
    }
    pcVar4 = pTab->zName;
    iVar2 = sqlite3VdbeAddOp3(p,0x6c,(int)uVar7,0,0);
    sqlite3VdbeChangeP4(p,iVar2,pcVar4,0);
    pcVar4 = sqlite3MPrintf(pParse->db,"tbl_name=%Q",zName);
    if (pcVar4 != (char *)0x0) {
      sqlite3VdbeAddParseSchemaOp(p,(int)uVar7,pcVar4);
      pcVar4 = whereTempTriggers(pParse,pTab);
      if (pcVar4 != (char *)0x0) {
        sqlite3VdbeAddParseSchemaOp(p,1,pcVar4);
        return;
      }
    }
  }
  return;
}

Assistant:

static void reloadTableSchema(Parse *pParse, Table *pTab, const char *zName){
  Vdbe *v;
  char *zWhere;
  int iDb;                   /* Index of database containing pTab */
#ifndef SQLITE_OMIT_TRIGGER
  Trigger *pTrig;
#endif

  v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return;
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  assert( iDb>=0 );

#ifndef SQLITE_OMIT_TRIGGER
  /* Drop any table triggers from the internal schema. */
  for(pTrig=sqlite3TriggerList(pParse, pTab); pTrig; pTrig=pTrig->pNext){
    int iTrigDb = sqlite3SchemaToIndex(pParse->db, pTrig->pSchema);
    assert( iTrigDb==iDb || iTrigDb==1 );
    sqlite3VdbeAddOp4(v, OP_DropTrigger, iTrigDb, 0, 0, pTrig->zName, 0);
  }
#endif

  /* Drop the table and index from the internal schema.  */
  sqlite3VdbeAddOp4(v, OP_DropTable, iDb, 0, 0, pTab->zName, 0);

  /* Reload the table, index and permanent trigger schemas. */
  zWhere = sqlite3MPrintf(pParse->db, "tbl_name=%Q", zName);
  if( !zWhere ) return;
  sqlite3VdbeAddParseSchemaOp(v, iDb, zWhere);

#ifndef SQLITE_OMIT_TRIGGER
  /* Now, if the table is not stored in the temp database, reload any temp 
  ** triggers. Don't use IN(...) in case SQLITE_OMIT_SUBQUERY is defined. 
  */
  if( (zWhere=whereTempTriggers(pParse, pTab))!=0 ){
    sqlite3VdbeAddParseSchemaOp(v, 1, zWhere);
  }
#endif
}